

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O3

void __thiscall phosg::Image::save(Image *this,FILE *f,Format format)

{
  undefined1 *puVar1;
  void *pvVar2;
  bool bVar3;
  uint uVar4;
  size_t size;
  long lVar5;
  runtime_error *prVar6;
  long lVar7;
  long lVar8;
  char *__format;
  ulong uVar9;
  size_t sVar10;
  ulong uVar11;
  long lVar12;
  uint8_t row_padding_data [4];
  uLongf idat_size;
  be_uint32_t gAMA;
  uint8_t SIG [8];
  char header [256];
  anon_struct_13_7_88857fac IHDR;
  code *local_188;
  void *local_180;
  undefined4 local_178;
  undefined4 uStack_174;
  void *local_170;
  anon_class_8_1_54a39806 local_168;
  size_t local_160;
  undefined4 local_154;
  undefined8 local_150;
  undefined1 local_148 [34];
  uint local_126;
  undefined8 local_122;
  undefined8 uStack_11a;
  undefined8 local_112;
  undefined8 uStack_10a;
  undefined8 local_102;
  undefined8 uStack_fa;
  undefined8 local_f2;
  undefined8 uStack_ea;
  undefined8 local_e2;
  undefined8 uStack_da;
  undefined8 local_d2;
  undefined8 uStack_ca;
  undefined4 local_c2;
  uint local_40;
  uint local_3c;
  undefined1 local_38;
  byte local_37;
  undefined2 local_36;
  undefined1 local_34;
  
  local_168.f = f;
  switch(format) {
  case GRAYSCALE_PPM:
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(prVar6,"can\'t save grayscale ppm files");
    break;
  case COLOR_PPM:
    __format = "P6 %zu %zu %lu\n";
    if (this->has_alpha != false) {
      __format = "P7\nWIDTH %zu\nHEIGHT %zu\nDEPTH 4\nMAXVAL %lu\nTUPLTYPE RGB_ALPHA\nENDHDR\n";
    }
    snprintf(local_148,0x100,__format,this->width,this->height,this->max_value);
    size = strlen(local_148);
    fwritex(f,local_148,size);
    fwritex(f,(this->data).raw,
            (ulong)(this->channel_width >> 3) * ((ulong)this->has_alpha + 3) *
            this->height * this->width);
    return;
  case WINDOWS_BITMAP:
    if (this->channel_width == '\b') {
      bVar3 = this->has_alpha;
      local_148._18_4_ = (undefined4)this->width;
      uVar4 = -(local_148._18_4_ * (bVar3 + 3)) & 3;
      local_178 = 0;
      local_148._22_4_ = (undefined4)this->height;
      lVar12 = 0x28;
      if (bVar3 != false) {
        lVar12 = 0x7c;
      }
      local_126 = local_148._22_4_ * local_148._18_4_ * 4;
      if (bVar3 == false) {
        local_126 = (uint)bVar3;
      }
      local_112 = 0;
      uStack_10a = 0;
      local_102 = 0;
      uStack_fa = 0;
      local_f2 = 0;
      uStack_ea = 0;
      local_e2 = 0;
      uStack_da = 0;
      local_d2 = 0;
      uStack_ca = 0;
      local_c2 = 0;
      local_148._0_2_ = 0x4d42;
      local_148._10_4_ = (undefined4)(lVar12 + 0xeU);
      local_148._2_4_ =
           local_148._22_4_ * local_148._18_4_ * (bVar3 + 3) + local_148._10_4_ +
           local_148._22_4_ * uVar4;
      local_148._6_4_ = 0;
      local_148._14_4_ = (undefined4)lVar12;
      local_148._26_2_ = 1;
      local_148._28_2_ = (ushort)bVar3 * 8 + 0x18;
      local_148._30_4_ = (uint)bVar3 + (uint)bVar3 * 2;
      local_122 = 0xb1200000b12;
      uStack_11a = 0;
      if (bVar3 == 1) {
        local_112 = 0xff00000000ff;
        uStack_10a = 0xff00000000ff0000;
        local_102 = 0x73524742;
        local_d2 = 0x800000000;
      }
      fwritex(f,local_148,lVar12 + 0xeU);
      if (this->has_alpha == true) {
        lVar12 = this->height;
        if (lVar12 < 1) {
          return;
        }
        lVar7 = lVar12 * 4;
        uVar11 = lVar12 + 1;
        do {
          lVar7 = lVar7 + -4;
          fwritex(f,(void *)(lVar7 * this->width + (long)(this->data).raw),this->width << 2);
          uVar11 = uVar11 - 1;
        } while (1 < uVar11);
        return;
      }
      malloc_unique((phosg *)&local_188,this->width * 3);
      pvVar2 = local_180;
      lVar12 = this->height;
      if (0 < lVar12) {
        lVar7 = lVar12 * 3;
        do {
          lVar7 = lVar7 + -3;
          lVar8 = this->width;
          if (lVar8 < 1) {
            sVar10 = lVar8 * 3;
          }
          else {
            lVar5 = 0;
            do {
              *(undefined1 *)((long)pvVar2 + lVar5) =
                   *(undefined1 *)((long)(this->data).raw + lVar5 + 2 + lVar8 * lVar7);
              *(undefined1 *)((long)pvVar2 + lVar5 + 1) =
                   *(undefined1 *)((long)(this->data).raw + lVar5 + 1 + this->width * lVar7);
              *(undefined1 *)((long)pvVar2 + lVar5 + 2) =
                   *(undefined1 *)((long)(this->data).raw + lVar5 + this->width * lVar7);
              lVar5 = lVar5 + 3;
              lVar8 = this->width;
              sVar10 = lVar8 * 3;
            } while (SBORROW8(lVar5,sVar10) != lVar5 + lVar8 * -3 < 0);
          }
          fwritex(f,pvVar2,sVar10);
          if ((ulong)uVar4 != 0) {
            fwritex(f,&local_178,(ulong)uVar4);
          }
          bVar3 = 1 < lVar12;
          lVar12 = lVar12 + -1;
        } while (bVar3);
      }
      if (local_180 == (void *)0x0) {
        return;
      }
      (*local_188)(local_180);
      return;
    }
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(prVar6,"can\'t save bmp with more than 8-bit channels");
    break;
  case PNG:
    if (this->channel_width == '\b') {
      local_150 = 0xa1a0a0d474e5089;
      fwritex(f,&local_150,8);
      uVar4 = (uint)this->width;
      local_40 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
      uVar4 = (uint)this->height;
      local_3c = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
      local_38 = 8;
      local_37 = this->has_alpha << 2 | 2;
      local_36 = 0;
      local_34 = 0;
      write_png_chunk<phosg::Image::save(_IO_FILE*,phosg::Image::Format)const::__0&>
                ((char (*) [5])"IHDR",&local_40,(be_uint32_t)0xd000000,&local_168);
      local_154 = 0x8fb10000;
      write_png_chunk<phosg::Image::save(_IO_FILE*,phosg::Image::Format)const::__0&>
                ((char (*) [5])"gAMA",&local_154,(be_uint32_t)0x4000000,&local_168);
      lVar12 = (ulong)this->has_alpha + 3;
      sVar10 = (this->width * lVar12 + 1) * this->height;
      malloc_unique((phosg *)&local_188,sVar10);
      if (this->height != 0) {
        uVar11 = 0;
        uVar9 = 1;
        do {
          lVar7 = this->width * lVar12;
          pvVar2 = (this->data).raw;
          puVar1 = (undefined1 *)((long)local_180 + (lVar7 + 1) * uVar11);
          *puVar1 = 0;
          memcpy(puVar1 + 1,(void *)(lVar7 * uVar11 + (long)pvVar2),this->width * lVar12);
          bVar3 = uVar9 < (ulong)this->height;
          uVar11 = uVar9;
          uVar9 = (ulong)((int)uVar9 + 1);
        } while (bVar3);
      }
      local_160 = compressBound(sVar10);
      malloc_unique((phosg *)&local_178,local_160);
      uVar4 = compress2(local_170,&local_160,local_180,sVar10,9);
      if (uVar4 == 0) {
        write_png_chunk<phosg::Image::save(_IO_FILE*,phosg::Image::Format)const::__0&>
                  ((char (*) [5])"IDAT",local_170,
                   (be_uint32_t)
                   ((uint)local_160 >> 0x18 | ((uint)local_160 & 0xff0000) >> 8 |
                    ((uint)local_160 & 0xff00) << 8 | (uint)local_160 << 0x18),&local_168);
        write_png_chunk<phosg::Image::save(_IO_FILE*,phosg::Image::Format)const::__0&>
                  ((char (*) [5])"IEND",(void *)0x0,(be_uint32_t)0x0,&local_168);
        if (local_170 != (void *)0x0) {
          (*(code *)CONCAT44(uStack_174,local_178))();
        }
        if (local_180 == (void *)0x0) {
          return;
        }
        (*local_188)();
        return;
      }
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      string_printf_abi_cxx11_
                ((string *)local_148,"zlib error compressing png data: %d",(ulong)uVar4);
      ::std::runtime_error::runtime_error(prVar6,(string *)local_148);
      __cxa_throw(prVar6,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
    }
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(prVar6,"can\'t save png with more than 8-bit channels");
    break;
  default:
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(prVar6,"unknown file format in Image::save()");
  }
  __cxa_throw(prVar6,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void Image::save(FILE* f, Format format) const {
  this->save_helper(format, [f](const void* data, size_t size) {
    fwritex(f, data, size);
  });
}